

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

unique_ptr<char_*[],_std::default_delete<char_*[]>_> __thiscall
testing::internal::CreateArgvFromArgs
          (internal *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  size_type sVar1;
  reference pvVar2;
  char *pcVar3;
  type ppcVar4;
  undefined8 local_28;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  __array *result;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(args);
  std::make_unique<char*[]>((size_t)this);
  for (local_28 = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), local_28 < sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,local_28);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pvVar2);
    ppcVar4 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                        ((unique_ptr<char_*[],_std::default_delete<char_*[]>_> *)this,local_28);
    *ppcVar4 = pcVar3;
  }
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  ppcVar4 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                      ((unique_ptr<char_*[],_std::default_delete<char_*[]>_> *)this,sVar1);
  *ppcVar4 = (char *)0x0;
  return (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)
         (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)this;
}

Assistant:

static std::unique_ptr<char*[]> CreateArgvFromArgs(
    std::vector<std::string>& args) {
  auto result = std::make_unique<char*[]>(args.size() + 1);
  for (size_t i = 0; i < args.size(); ++i) {
    result[i] = &args[i][0];
  }
  result[args.size()] = nullptr;  // extra null terminator
  return result;
}